

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
::run_impl(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  ostream *i_ostream;
  undefined8 uVar1;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  *pQVar2;
  long *plVar3;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  *pQVar4;
  pointer pTVar5;
  int iVar6;
  ThreadData *thread;
  uint64_t uVar7;
  ulong uVar8;
  pointer pTVar9;
  int *piVar10;
  size_t i_target_consume_count;
  pointer __n;
  ulong i_target_put_count_00;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer __args;
  pointer extraout_RDX_03;
  void *__buf;
  void *__buf_00;
  ThreadData *thread_1;
  uint64_t i_affinity_mask;
  int64_t *__args_00;
  ulong uVar11;
  long lVar12;
  PutTypeCounters *counter;
  size_t sVar13;
  __atomic_base<unsigned_long> _Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict1 threads;
  long spawned;
  FinalStats final_state;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  histogram<long,_true> histogram_spawned;
  histogram<long,_true> histogram_except_cons;
  histogram<long,_true> histogram_except_puts;
  ostream local_5fa;
  byte local_5f9;
  QueueTesterFlags local_5f8;
  QueueTesterFlags local_5f4;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  *local_5f0;
  size_t local_5e8;
  EasyRandom *local_5e0;
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  local_5d8;
  long local_5b8;
  long *local_5b0;
  long *local_5a8;
  undefined8 local_598;
  undefined8 uStack_590;
  __native_type local_588;
  UnmovableFastTestAllocator<256UL> UStack_560;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 local_518 [376];
  pointer local_3a0;
  iterator local_398;
  long *local_390;
  undefined1 local_370 [376];
  pointer local_1f8;
  iterator local_1f0;
  long *local_1e8;
  undefined1 local_1d0 [376];
  pointer local_58;
  iterator local_50;
  long *local_48;
  
  lVar12 = *(long *)(this + 0x20);
  local_5f8 = i_flags;
  local_5e0 = i_random;
  if ((((*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3 != lVar12) ||
       (*(long *)(this + 0x60) - *(long *)(this + 0x58) >> 3 != lVar12)) ||
      (*(long *)(this + 0x78) - *(long *)(this + 0x70) >> 3 != lVar12)) ||
     (*(long *)(this + 0x90) - *(long *)(this + 0x88) >> 3 != lVar12)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  local_5f4 = local_5f8;
  UStack_560.m_total_allocations.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UStack_560.m_living_allocations.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UStack_560.m_living_bytes.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UStack_560.m_total_allocated_pages.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UStack_560.m_living_pins.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0
  ;
  local_588.__data.__list.__next = (__pthread_internal_list *)0x0;
  UStack_560.m_living_pages.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_588._16_8_ = 0;
  local_588.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_588.__align = 0;
  local_588._8_8_ = 0;
  local_530 = 0xef;
  local_528 = 0xef;
  local_5d8.
  super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.
  super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5fa = (ostream)0x0;
  local_5e8 = i_target_put_count;
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
  ::reserve(&local_5d8,*(size_type *)(this + 0xa0));
  if (*(long *)(this + 0xa0) != 0) {
    uVar11 = 0;
    do {
      local_518._0_8_ = &local_5fa;
      std::
      vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData>>
      ::
      emplace_back<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>const&,density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::FeedBack*,density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
                ((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>::ThreadData>>
                  *)&local_5d8,
                 (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                  *)this,(FeedBack **)local_518,
                 (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                  *)&local_588.__data,local_5e0,&local_5f8);
      uVar11 = uVar11 + 1;
    } while (uVar11 < *(ulong *)(this + 0xa0));
  }
  local_5f0 = this;
  uVar7 = get_num_of_processors();
  pQVar4 = local_5f0;
  uVar11 = *(ulong *)(local_5f0 + 0xa0);
  if (uVar11 != 0) {
    i_affinity_mask = 0xffffffffffffffff;
    if (1 < uVar7) {
      i_affinity_mask =
           (ulong)-(uint)((local_5f8 & eReserveCoreToMainThread) == eNone || uVar7 < 4) |
           0xfffffffffffffffd;
    }
    lVar12 = 0;
    sVar13 = 0;
    do {
      uVar8 = local_5e8 / uVar11;
      i_target_put_count_00 = uVar8;
      if (sVar13 == 0) {
        i_target_put_count_00 = local_5e8 % uVar11 + uVar8;
      }
      i_target_consume_count = local_5e8 % uVar11 + uVar8;
      if (sVar13 != 0) {
        i_target_consume_count = uVar8;
      }
      ThreadData::start((ThreadData *)
                        ((long)((local_5d8.
                                 super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_random).m_rand._M_x +
                        lVar12 + -0x50),sVar13,i_target_put_count_00,i_target_consume_count,
                        i_affinity_mask);
      sVar13 = sVar13 + 1;
      uVar11 = *(ulong *)(pQVar4 + 0xa0);
      lVar12 = lVar12 + 0x1440;
    } while (sVar13 < uVar11);
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter
            ((LineUpdaterStreamAdapter *)local_518,*(ostream **)pQVar4);
  sVar13 = local_5e8;
  Progress::Progress((Progress *)local_1d0,local_5e8);
  do {
    if (local_5d8.
        super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_5d8.
        super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var14._M_i = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      _Var14._M_i = 0;
      pTVar9 = local_5d8.
               super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar11 = uVar11 + (__int_type)
                          (((pTVar9->m_incremental_stats)._M_t.
                            super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                            .
                            super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                           ._M_head_impl)->m_produced).super___atomic_base<unsigned_long>;
        _Var14._M_i = _Var14._M_i +
                      (((pTVar9->m_incremental_stats)._M_t.
                        super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        .
                        super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                       ._M_head_impl)->m_consumed).super___atomic_base<unsigned_long>._M_i;
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != local_5d8.
                         super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((sVar13 < _Var14._M_i) || (sVar13 < uVar11)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_5f9 = sVar13 <= uVar11;
    lVar12 = uVar11 - _Var14._M_i;
    if (uVar11 < _Var14._M_i || lVar12 == 0) {
      local_5fa = (ostream)0x0;
    }
    else {
      auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(_Var14._M_i >> 0x20);
      auVar16._0_8_ = _Var14._M_i;
      auVar16._12_4_ = 0x45300000;
      local_5fa = (ostream)(0.2 < ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                                  ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)_Var14._M_i) -
                                  4503599627370496.0)));
    }
    i_ostream = (ostream *)(local_518 + 0x28);
    local_5e0._0_1_ = sVar13 <= _Var14._M_i;
    if ((local_5f8 & ePrintProgress) != eNone) {
      local_1d0._0_8_ = _Var14._M_i;
      std::__ostream_insert<char,std::char_traits<char>>(i_ostream,"Active threads: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::__ostream_insert<char,std::char_traits<char>>(i_ostream,", Consumed: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      std::__ostream_insert<char,std::char_traits<char>>(i_ostream," (",2);
      Progress::write_to_stream((Progress *)local_1d0,i_ostream);
      std::__ostream_insert<char,std::char_traits<char>>(i_ostream,"), enqueued: ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)i_ostream);
      LineUpdaterStreamAdapter::end_line_impl((LineUpdaterStreamAdapter *)local_518);
    }
    sVar13 = local_5e8;
    local_5e0._0_1_ = (byte)local_5e0 & local_5f9;
    if ((byte)local_5e0 != 0) {
      LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter((LineUpdaterStreamAdapter *)local_518);
      pTVar5 = local_5d8.
               super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pQVar4 = local_5f0;
      for (pTVar9 = local_5d8.
                    super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                    ._M_impl.super__Vector_impl_data._M_start; pTVar9 != pTVar5; pTVar9 = pTVar9 + 1
          ) {
        std::thread::join();
      }
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_518,"spawned by i-th thread",0x19,8);
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_1d0,"exceptions_during_puts",0x19,8);
      __n = (pointer)0x8;
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_370,"exceptions_during_consumes",0x19,8);
      std::
      vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
      ::vector((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::PutTypeCounters>_>
                *)&local_5b0,*(long *)(pQVar4 + 0x48) - *(long *)(pQVar4 + 0x40) >> 3,
               (allocator_type *)&local_5b8);
      local_598 = 0;
      uStack_590 = 0;
      __args = extraout_RDX;
      pQVar2 = local_5f0;
      plVar3 = local_5b0;
      if (*(long *)(pQVar4 + 0xa0) != 0) {
        uVar11 = 0;
        do {
          pTVar5 = local_5d8.
                   super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pTVar9 = local_5d8.
                   super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11;
          FinalStats::operator+=((FinalStats *)&local_5b0,&pTVar9->m_final_stats);
          __args = pTVar5[uVar11].m_final_stats.m_counters.
                   super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_5b8 = 0;
          for (__n = (pTVar9->m_final_stats).m_counters.
                     super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                     ._M_impl.super__Vector_impl_data._M_start; __n != __args; __n = __n + 1) {
            local_5b8 = local_5b8 + __n->m_spawned;
          }
          if (local_398._M_current == local_390) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_3a0,local_398,&local_5b8);
            __args = extraout_RDX_00;
          }
          else {
            *local_398._M_current = local_5b8;
            local_398._M_current = local_398._M_current + 1;
          }
          if ((local_5f4 & eTestExceptions) != eNone) {
            __args = (pointer)&pTVar5[uVar11].m_final_stats.m_exceptions_during_puts;
            if (local_50._M_current == local_48) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_58,local_50,(long *)__args);
              __args = extraout_RDX_01;
            }
            else {
              *local_50._M_current = *(long *)__args;
              local_50._M_current = local_50._M_current + 1;
            }
            __args_00 = &pTVar5[uVar11].m_final_stats.m_exceptions_during_consumes;
            if (local_1f0._M_current == local_1e8) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_1f8,local_1f0,__args_00);
              __args = extraout_RDX_02;
            }
            else {
              *local_1f0._M_current = *__args_00;
              local_1f0._M_current = local_1f0._M_current + 1;
            }
          }
          uVar11 = uVar11 + 1;
          pQVar2 = local_5f0;
          plVar3 = local_5b0;
        } while (uVar11 < *(ulong *)(local_5f0 + 0xa0));
      }
      for (; pQVar4 = local_5f0, plVar3 != local_5a8; plVar3 = plVar3 + 2) {
        local_5f0 = pQVar2;
        if (*plVar3 != 0) {
          detail::assert_failed<>
                    ("counter.m_existing == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                     ,0x114);
          __args = extraout_RDX_03;
        }
        pQVar2 = local_5f0;
        local_5f0 = pQVar4;
      }
      uVar1 = *(undefined8 *)local_5f0;
      local_5f0 = pQVar2;
      histogram<long,_true>::write((histogram<long,_true> *)local_518,(int)uVar1,__args,(size_t)__n)
      ;
      if ((local_5f4 & eTestExceptions) != eNone) {
        histogram<long,_true>::write
                  ((histogram<long,_true> *)local_1d0,(int)*(undefined8 *)pQVar4,__buf,(size_t)__n);
        histogram<long,_true>::write
                  ((histogram<long,_true> *)local_370,(int)*(undefined8 *)pQVar4,__buf_00,
                   (size_t)__n);
      }
      if (local_5b0 != (long *)0x0) {
        operator_delete(local_5b0);
      }
      if (local_1f8 != (pointer)0x0) {
        operator_delete(local_1f8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
      std::ios_base::~ios_base((ios_base *)(local_370 + 0x70));
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base((ios_base *)(local_1d0 + 0x70));
      if (local_3a0 != (pointer)0x0) {
        operator_delete(local_3a0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
      std::ios_base::~ios_base((ios_base *)(local_518 + 0x70));
      std::
      vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>::ThreadData>_>
      ::~vector(&local_5d8);
      density::
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
      destroy((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
               *)&UStack_560);
      UnmovableFastTestAllocator<256UL>::~UnmovableFastTestAllocator(&UStack_560);
      return;
    }
    local_370._0_8_ = 0;
    local_370._8_8_ = 200000000;
    do {
      iVar6 = nanosleep((timespec *)local_370,(timespec *)local_370);
      if (iVar6 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
  } while( true );
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }